

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O2

void __thiscall kj::_::Once::runOnce(Once *this,undefined8 *init)

{
  int iVar1;
  bool bVar2;
  UnwindDetector _kjUnwindDetector526;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_c__:519:7)>
  local_38;
  
  do {
    LOCK();
    iVar1 = *(int *)this;
    bVar2 = iVar1 == 0;
    if (bVar2) {
      *(undefined4 *)this = 1;
      iVar1 = 0;
    }
    UNLOCK();
    if (bVar2) {
      UnwindDetector::UnwindDetector(&_kjUnwindDetector526);
      local_38.maybeFunc.ptr.isSet = true;
      local_38.maybeFunc.ptr.field_1.value._kjUnwindDetector526 = &_kjUnwindDetector526;
      local_38.maybeFunc.ptr.field_1.value.this = this;
      (**(code **)*init)(init);
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++:519:7)>
      ::~Deferred(&local_38);
      LOCK();
      iVar1 = *(int *)this;
      *(undefined4 *)this = 3;
      UNLOCK();
      if (iVar1 == 2) {
        syscall(0xca,this,0x81,0x7fffffff,0,0,0);
      }
      return;
    }
LAB_0039ff27:
    do {
      if (iVar1 == 1) {
        LOCK();
        iVar1 = *(int *)this;
        bVar2 = iVar1 == 1;
        if (bVar2) {
          *(undefined4 *)this = 2;
          iVar1 = 1;
        }
        UNLOCK();
        if (!bVar2) goto LAB_0039ff27;
      }
      else if (iVar1 == 3) {
        return;
      }
      syscall(0xca,this,0x80,2,0,0,0);
      iVar1 = *(int *)this;
    } while (iVar1 != 0);
  } while( true );
}

Assistant:

void Once::runOnce(Initializer& init, LockSourceLocationArg location) {
startOver:
  uint state = UNINITIALIZED;
  if (__atomic_compare_exchange_n(&futex, &state, INITIALIZING, false,
                                  __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
    // It's our job to initialize!
    {
      KJ_ON_SCOPE_FAILURE({
        // An exception was thrown by the initializer.  We have to revert.
        if (__atomic_exchange_n(&futex, UNINITIALIZED, __ATOMIC_RELEASE) ==
            INITIALIZING_WITH_WAITERS) {
          // Someone was waiting for us to finish.
          syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, nullptr, nullptr, 0);
        }
      });

      init.run();
    }
    if (__atomic_exchange_n(&futex, INITIALIZED, __ATOMIC_RELEASE) ==
        INITIALIZING_WITH_WAITERS) {
      // Someone was waiting for us to finish.
      syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, nullptr, nullptr, 0);
    }
  } else {
    BlockedOnReason blockReason = BlockedOnOnceInit{*this, location};
    KJ_DEFER(setCurrentThreadIsNoLongerWaiting());

    for (;;) {
      if (state == INITIALIZED) {
        break;
      } else if (state == INITIALIZING) {
        // Initialization is taking place in another thread.  Indicate that we're waiting.
        if (!__atomic_compare_exchange_n(&futex, &state, INITIALIZING_WITH_WAITERS, true,
                                         __ATOMIC_ACQUIRE, __ATOMIC_ACQUIRE)) {
          // State changed, retry.
          continue;
        }
      } else {
        KJ_DASSERT(state == INITIALIZING_WITH_WAITERS);
      }

      // Wait for initialization.
      setCurrentThreadIsWaitingFor(&blockReason);
      syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, INITIALIZING_WITH_WAITERS,
                         nullptr, nullptr, 0);
      state = __atomic_load_n(&futex, __ATOMIC_ACQUIRE);

      if (state == UNINITIALIZED) {
        // Oh hey, apparently whoever was trying to initialize gave up.  Let's take it from the
        // top.
        goto startOver;
      }
    }
  }
}